

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::
         GeneratedClassNameImpl<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  size_type *psVar4;
  long *plVar5;
  long lVar6;
  long *local_b8;
  ulong local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  ClassNamePrefix<google::protobuf::Descriptor>
            (&local_98,(anon_unknown_2 *)**(undefined8 **)(desc + 8),
             (string *)(*(undefined8 **)(desc + 8))[1],*(Descriptor **)(desc + 0x10));
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_98,**(ulong **)(desc + 8));
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar6 = plVar2[3];
    local_78->_M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  lVar6 = *(long *)(desc + 0x18);
  psVar3 = (string *)desc;
  if (lVar6 != 0) {
    do {
      ClassNamePrefix<google::protobuf::Descriptor>
                (&local_50,(anon_unknown_2 *)**(undefined8 **)(lVar6 + 8),
                 (string *)(*(undefined8 **)(lVar6 + 8))[1],*(Descriptor **)(desc + 0x10));
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_50,**(ulong **)(lVar6 + 8));
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar5;
        local_b8 = (long *)*plVar2;
      }
      local_b0 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar2;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,
                                  (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98.field_2._8_8_ = plVar2[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_98._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      psVar3 = (string *)&local_50.field_2;
      if ((string *)local_50._M_dataplus._M_p != psVar3) {
        operator_delete(local_50._M_dataplus._M_p);
        psVar3 = extraout_RAX;
      }
      lVar6 = *(long *)(lVar6 + 0x18);
    } while (lVar6 != 0);
  }
  return psVar3;
}

Assistant:

std::string GeneratedClassNameImpl(const DescriptorType* desc) {
  std::string classname = ClassNamePrefix(desc->name(), desc) + desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = ClassNamePrefix(containing->name(), desc) + containing->name()
       + '\\' + classname;
    containing = containing->containing_type();
  }
  return classname;
}